

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NameValuePragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NameValuePragmaExpressionSyntax,slang::syntax::NameValuePragmaExpressionSyntax_const&>
          (BumpAllocator *this,NameValuePragmaExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  Info *pIVar4;
  PragmaExpressionSyntax *pPVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  NameValuePragmaExpressionSyntax *pNVar15;
  
  pNVar15 = (NameValuePragmaExpressionSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PragmaExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode;
  TVar7 = (args->name).kind;
  uVar8 = (args->name).field_0x2;
  NVar9.raw = (args->name).numFlags.raw;
  uVar10 = (args->name).rawLen;
  pIVar3 = (args->name).info;
  TVar11 = (args->equals).kind;
  uVar12 = (args->equals).field_0x2;
  NVar13.raw = (args->equals).numFlags.raw;
  uVar14 = (args->equals).rawLen;
  pIVar4 = (args->equals).info;
  pPVar5 = (args->value).ptr;
  (pNVar15->super_PragmaExpressionSyntax).super_SyntaxNode.kind =
       (args->super_PragmaExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar15->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pNVar15->super_PragmaExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  (pNVar15->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pNVar15->name).kind = TVar7;
  (pNVar15->name).field_0x2 = uVar8;
  (pNVar15->name).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar15->name).rawLen = uVar10;
  (pNVar15->name).info = pIVar3;
  (pNVar15->equals).kind = TVar11;
  (pNVar15->equals).field_0x2 = uVar12;
  (pNVar15->equals).numFlags = (NumericTokenFlags)NVar13.raw;
  (pNVar15->equals).rawLen = uVar14;
  (pNVar15->equals).info = pIVar4;
  (pNVar15->value).ptr = pPVar5;
  return pNVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }